

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O2

int ply_write_chunk(p_ply ply,void *anybuffer,size_t size)

{
  uint uVar1;
  size_t sVar2;
  ulong uVar3;
  
  if (((ply == (p_ply)0x0) || (ply->fp == (FILE *)0x0)) || (ply->io_mode != PLY_WRITE)) {
    __assert_fail("ply && ply->fp && ply->io_mode == PLY_WRITE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                  ,0x431,"int ply_write_chunk(p_ply, void *, size_t)");
  }
  if (0x2000 < ply->buffer_last) {
    __assert_fail("ply->buffer_last <= BUFFERSIZE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                  ,0x432,"int ply_write_chunk(p_ply, void *, size_t)");
  }
  uVar3 = 0;
  do {
    if (size <= uVar3) {
      return 1;
    }
    while (0x1fff < ply->buffer_last) {
      ply->buffer_last = 0;
      sVar2 = fwrite(ply->buffer,1,0x2000,(FILE *)ply->fp);
      uVar1 = (uint)(sVar2 >= 0x2000);
      if (sVar2 < 0x2000) {
        return uVar1;
      }
      if (size <= uVar3) {
        return uVar1;
      }
    }
    ply->buffer[ply->buffer_last] = *(char *)((long)anybuffer + uVar3);
    ply->buffer_last = ply->buffer_last + 1;
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

static int ply_write_chunk(p_ply ply, void *anybuffer, size_t size) {
    char *buffer = (char *) anybuffer;
    size_t i = 0;
    assert(ply && ply->fp && ply->io_mode == PLY_WRITE);
    assert(ply->buffer_last <= BUFFERSIZE);
    while (i < size) {
        if (ply->buffer_last < BUFFERSIZE) {
            ply->buffer[ply->buffer_last] = buffer[i];
            ply->buffer_last++;
            i++;
        } else {
            ply->buffer_last = 0;
            if (fwrite(ply->buffer, 1, BUFFERSIZE, ply->fp) < BUFFERSIZE)
                return 0;
        }
    }
    return 1;
}